

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void openjtalk_clear(OpenJTalk *oj)

{
  if (oj != (OpenJTalk *)0x0) {
    openjtalk_stop(oj);
    Pa_Terminate();
    if ((g_psd != (SpeakData *)0x0) && (g_psd->data != (short *)0x0)) {
      free(g_psd->data);
      g_psd->data = (short *)0x0;
    }
    Open_JTalk_clear(oj->open_jtalk);
    return;
  }
  g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_clear(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}
	openjtalk_stop(oj);
#if (!defined(_WIN32) || defined(__CYGWIN__) || defined(__MINGW32__)) || defined(WINDOWS_PORTAUDIO)
	Pa_Terminate();
#else
#endif
	if (g_psd != NULL && g_psd->data)
	{
		free(g_psd->data);
		g_psd->data = NULL;
	}
	Open_JTalk_clear(oj->open_jtalk);
}